

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line.c
# Opt level: O3

int dwarf_srclines_table_offset
              (Dwarf_Line_Context line_context,Dwarf_Unsigned *offset,Dwarf_Error *error)

{
  int iVar1;
  
  if ((line_context == (Dwarf_Line_Context)0x0) || (line_context->lc_magic != 0xd00d1111)) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x131);
    iVar1 = 1;
  }
  else {
    *offset = line_context->lc_section_offset;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
dwarf_srclines_table_offset(Dwarf_Line_Context line_context,
    Dwarf_Unsigned * offset,
    Dwarf_Error  *    error)
{
    if (!line_context ){
        _dwarf_error(NULL, error, DW_DLE_LINE_CONTEXT_BOTCH);
        return DW_DLV_ERROR;
    }
    if ( line_context->lc_magic != DW_CONTEXT_MAGIC) {
        _dwarf_error(NULL, error,
            DW_DLE_LINE_CONTEXT_BOTCH);
        return DW_DLV_ERROR;
    }
    *offset = line_context->lc_section_offset;
    return DW_DLV_OK;
}